

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

errr grab_int_range(int *lo,int *hi,char *range,char *sep)

{
  ushort *puVar1;
  int *piVar2;
  _Bool _Var3;
  long lVar4;
  ushort **ppuVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  errr eVar9;
  char *__haystack;
  char *pe;
  int *local_40;
  int *local_38;
  
  local_38 = lo;
  lVar4 = strtol(range,&pe,10);
  __haystack = pe;
  eVar9 = 0x25;
  if (pe != range) {
    local_40 = hi;
    ppuVar5 = __ctype_b_loc();
    puVar1 = *ppuVar5;
    if (0xffffffff00000001 < lVar4 - 0x7fffffffU &&
        (*(byte *)((long)puVar1 + (long)*__haystack * 2 + 1) & 0x20) != 0) {
      if (sep != (char *)0x0) {
        pcVar6 = strstr(__haystack,sep);
        if (pcVar6 == (char *)0x0) {
          return 0x25;
        }
        pe = pcVar6;
        sVar7 = strspn(__haystack," \t");
        if (__haystack + sVar7 != pcVar6) {
          return 0x25;
        }
        sVar7 = strlen(sep);
        if ((*(byte *)((long)puVar1 + (long)pcVar6[sVar7] * 2 + 1) & 0x20) == 0) {
          return 0x25;
        }
        __haystack = pcVar6 + sVar7;
      }
      lVar8 = strtol(__haystack,&pe,10);
      piVar2 = local_40;
      if (((pe != __haystack) && (_Var3 = contains_only_spaces(pe), _Var3)) &&
         (lVar8 + 0x7fffffffU >> 1 < 0x7fffffff)) {
        *local_38 = (int)lVar4;
        *piVar2 = (int)lVar8;
        eVar9 = 0;
      }
    }
  }
  return eVar9;
}

Assistant:

errr grab_int_range(int *lo, int *hi, const char *range, const char *sep)
{
	char *pe;
	long lv1 = strtol(range, &pe, 10), lv2;

	/*
	 * Reject INT_MIN and INT_MAX as well so don't have to check errno in
	 * order to recognize overflow when sizeof(int) == sizeof(long).
	 */
	if (pe == range || !isspace(*pe) || lv1 <= INT_MIN || lv1 >= INT_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	range = pe;
	if (sep) {
		size_t nonwhite_offset;

		pe = strstr(range, sep);
		if (!pe) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		nonwhite_offset = strspn(range, " \t");
		if (range + nonwhite_offset != pe) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		range = pe + strlen(sep);
		if (!isspace(*range)) {
			return PARSE_ERROR_INVALID_VALUE;
		}
	}
	lv2 = strtol(range, &pe, 10);
	if (pe == range || !contains_only_spaces(pe) || lv2 <= INT_MIN
			|| lv2 >= INT_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	*lo = (int)lv1;
	*hi = (int)lv2;
	return PARSE_ERROR_NONE;
}